

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

size_t drwav__on_read_memory(void *pUserData,void *pBufferOut,size_t bytesToRead)

{
  ulong __n;
  
  __n = *(long *)((long)pUserData + 8) - *(long *)((long)pUserData + 0x10);
  if (bytesToRead <= __n) {
    __n = bytesToRead;
  }
  if (__n != 0) {
    memcpy(pBufferOut,(void *)(*(long *)((long)pUserData + 0x10) + *pUserData),__n);
    *(long *)((long)pUserData + 0x10) = *(long *)((long)pUserData + 0x10) + __n;
  }
  return __n;
}

Assistant:

static size_t drwav__on_read_memory(void* pUserData, void* pBufferOut, size_t bytesToRead)
{
    drwav__memory_stream* memory = (drwav__memory_stream*)pUserData;
    drwav_assert(memory != NULL);
    drwav_assert(memory->dataSize >= memory->currentReadPos);

    size_t bytesRemaining = memory->dataSize - memory->currentReadPos;
    if (bytesToRead > bytesRemaining) {
        bytesToRead = bytesRemaining;
    }

    if (bytesToRead > 0) {
        DRWAV_COPY_MEMORY(pBufferOut, memory->data + memory->currentReadPos, bytesToRead);
        memory->currentReadPos += bytesToRead;
    }

    return bytesToRead;
}